

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::AddIncludeFlags
          (cmMakefileTargetGenerator *this,string *flags,string *lang)

{
  cmMakefile *this_00;
  bool forResponseFile;
  char *pcVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *makefile_depends;
  string *config;
  string includeFlags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string name;
  string arg;
  string local_88;
  string responseVar;
  string local_48;
  
  std::__cxx11::string::string((string *)&responseVar,"CMAKE_",(allocator *)&local_88);
  std::__cxx11::string::append((string *)&responseVar);
  std::__cxx11::string::append((char *)&responseVar);
  forResponseFile = cmMakefile::IsOn((this->super_cmCommonTargetGenerator).Makefile,&responseVar);
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string((string *)&includeFlags,"CMAKE_BUILD_TYPE",(allocator *)&name);
  pcVar1 = cmMakefile::GetSafeDefinition(this_00,&includeFlags);
  std::__cxx11::string::string((string *)&local_88,pcVar1,(allocator *)&arg);
  std::__cxx11::string::~string((string *)&includeFlags);
  config = &local_88;
  cmLocalGenerator::GetIncludeDirectories
            ((cmLocalGenerator *)this->LocalGenerator,&includes,
             (this->super_cmCommonTargetGenerator).GeneratorTarget,lang,config,true);
  cmLocalGenerator::GetIncludeFlags
            (&includeFlags,(cmLocalGenerator *)this->LocalGenerator,&includes,
             (this->super_cmCommonTargetGenerator).GeneratorTarget,lang,false,forResponseFile,config
            );
  if (includeFlags._M_string_length != 0) {
    if (forResponseFile) {
      std::__cxx11::string::string((string *)&name,"includes_",(allocator *)&arg);
      std::__cxx11::string::append((string *)&name);
      std::__cxx11::string::append((char *)&name);
      makefile_depends =
           &std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmMakefileTargetGenerator::StringList,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmMakefileTargetGenerator::StringList>_>_>
            ::operator[](&this->FlagFileDepends,lang)->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ;
      CreateResponseFile(&local_48,this,name._M_dataplus._M_p,&includeFlags,makefile_depends);
      std::operator+(&arg,"@",&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
        _vptr_cmLocalGenerator[6])(this->LocalGenerator,flags,&arg);
      std::__cxx11::string::~string((string *)&arg);
      std::__cxx11::string::~string((string *)&name);
    }
    else {
      (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
        _vptr_cmLocalGenerator[6])(this->LocalGenerator,flags,&includeFlags,config);
    }
  }
  std::__cxx11::string::~string((string *)&includeFlags);
  std::__cxx11::string::~string((string *)&local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&includes);
  std::__cxx11::string::~string((string *)&responseVar);
  return;
}

Assistant:

void cmMakefileTargetGenerator::AddIncludeFlags(std::string& flags,
                                                const std::string& lang)
{
  std::string responseVar = "CMAKE_";
  responseVar += lang;
  responseVar += "_USE_RESPONSE_FILE_FOR_INCLUDES";
  bool useResponseFile = this->Makefile->IsOn(responseVar);

  std::vector<std::string> includes;
  const std::string& config =
    this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  this->LocalGenerator->GetIncludeDirectories(includes, this->GeneratorTarget,
                                              lang, config);

  std::string includeFlags = this->LocalGenerator->GetIncludeFlags(
    includes, this->GeneratorTarget, lang, false, useResponseFile, config);
  if (includeFlags.empty()) {
    return;
  }

  if (useResponseFile) {
    std::string name = "includes_";
    name += lang;
    name += ".rsp";
    std::string arg = "@" +
      this->CreateResponseFile(name.c_str(), includeFlags,
                               this->FlagFileDepends[lang]);
    this->LocalGenerator->AppendFlags(flags, arg);
  } else {
    this->LocalGenerator->AppendFlags(flags, includeFlags);
  }
}